

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

expression_ptr __thiscall mjs::parser::parse_unary_expression(parser *this)

{
  bool bVar1;
  int iVar2;
  pointer peVar3;
  wostream *pwVar4;
  identifier_expression *piVar5;
  wstring *pwVar6;
  syntax_node *psVar7;
  source_extend *psVar8;
  type e_00;
  socklen_t *in_RCX;
  parser *in_RSI;
  wchar_t *in_R9;
  wstring_view message;
  wstring_view message_00;
  wstring local_410 [32];
  undefined1 local_3f0 [16];
  mjs local_3e0 [16];
  wstring local_3d0;
  wostringstream local_3b0 [8];
  wostringstream _oss_1;
  wstring local_238 [32];
  undefined1 local_218 [16];
  mjs local_208 [16];
  wstring local_1f8;
  wostringstream local_1d8 [8];
  wostringstream _oss;
  undefined1 local_50 [8];
  expression_ptr e;
  token_type local_1c;
  token_type t;
  parser *this_local;
  
  this_local = this;
  local_1c = current_token_type(in_RSI);
  if ((((local_1c - plusplus < 2) || (local_1c - not_ < 2)) || (local_1c - plus < 2)) ||
     (((local_1c == delete_ || (local_1c == typeof_)) || (local_1c == void_)))) {
    accept((parser *)&e,(int)in_RSI,(sockaddr *)(ulong)local_1c,in_RCX);
    token::~token((token *)&e);
    parse_unary_expression((parser *)local_50);
    if ((in_RSI->strict_mode_ & 1U) != 0) {
      if (local_1c == delete_) {
        peVar3 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator->
                           ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                            local_50);
        iVar2 = (*(peVar3->super_syntax_node)._vptr_syntax_node[3])();
        if (iVar2 == 0) {
          std::__cxx11::wostringstream::wostringstream(local_1d8);
          pwVar4 = std::operator<<((wostream *)local_1d8,"May not delete unqualified identifier \"")
          ;
          piVar5 = (identifier_expression *)
                   std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                   operator*((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                             local_50);
          pwVar6 = identifier_expression::id_abi_cxx11_(piVar5);
          local_208 = (mjs  [16])
                      std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pwVar6);
          cpp_quote_abi_cxx11_(&local_1f8,local_208,local_208._8_8_);
          pwVar4 = std::operator<<(pwVar4,(wstring *)&local_1f8);
          std::operator<<(pwVar4,"\" in strict mode");
          std::__cxx11::wstring::~wstring((wstring *)&local_1f8);
          psVar7 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                    operator->((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *
                               )local_50)->super_syntax_node;
          psVar8 = syntax_node::extend(psVar7);
          std::__cxx11::wostringstream::str();
          local_218 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_238);
          message._M_str = in_R9;
          message._M_len = local_218._8_8_;
          syntax_error((parser *)"parse_unary_expression",(char *)0x240,(int)psVar8,local_218._0_8_,
                       message);
        }
      }
      e_00 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                       ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                        local_50);
      bVar1 = is_strict_mode_unassignable_identifier(e_00);
      if (bVar1) {
        std::__cxx11::wostringstream::wostringstream(local_3b0);
        pwVar4 = std::operator<<((wostream *)local_3b0,"\"");
        piVar5 = (identifier_expression *)
                 std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                           ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                            local_50);
        pwVar6 = identifier_expression::id_abi_cxx11_(piVar5);
        local_3e0 = (mjs  [16])
                    std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)pwVar6);
        cpp_quote_abi_cxx11_(&local_3d0,local_3e0,local_3e0._8_8_);
        pwVar4 = std::operator<<(pwVar4,(wstring *)&local_3d0);
        std::operator<<(pwVar4,"\" may not be modified in strict mode");
        std::__cxx11::wstring::~wstring((wstring *)&local_3d0);
        psVar7 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::
                  operator->((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
                             local_50)->super_syntax_node;
        psVar8 = syntax_node::extend(psVar7);
        std::__cxx11::wostringstream::str();
        local_3f0 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_410);
        message_00._M_str = in_R9;
        message_00._M_len = local_3f0._8_8_;
        syntax_error((parser *)"parse_unary_expression",(char *)0x243,(int)psVar8,local_3f0._0_8_,
                     message_00);
      }
    }
    make_expression<mjs::prefix_expression,mjs::token_type&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              (this,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               &stack0xffffffffffffffe4);
    std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
              ((unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_50);
  }
  else {
    parse_postfix_expression(this);
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_unary_expression() {
        switch (auto t = current_token_type(); t) {
        case token_type::delete_:
        case token_type::void_:
        case token_type::typeof_:
        case token_type::plusplus:
        case token_type::minusminus:
        case token_type::plus:
        case token_type::minus:
        case token_type::tilde:
        case token_type::not_:
            {
                accept(t);
                auto e = parse_unary_expression();
                if (strict_mode_) {
                    if (t == token_type::delete_ && e->type() == expression_type::identifier) {
                        SYNTAX_ERROR_AT("May not delete unqualified identifier \"" << cpp_quote(static_cast<const identifier_expression&>(*e).id()) << "\" in strict mode", e->extend());
                    }
                    if (is_strict_mode_unassignable_identifier(*e)) {
                        SYNTAX_ERROR_AT("\"" << cpp_quote(static_cast<const identifier_expression&>(*e).id()) << "\" may not be modified in strict mode", e->extend());
                    }
                }
                return make_expression<prefix_expression>(t, std::move(e));
            }
        default:
            return parse_postfix_expression();
        }
    }